

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerHLSL::bitcast_glsl_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *out_type,SPIRType *in_type)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  runtime_error *prVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar1 = *(uint *)&(out_type->super_IVariant).field_0xc;
  uVar3 = uVar1 ^ 8;
  uVar2 = *(uint *)&(in_type->super_IVariant).field_0xc;
  if (uVar3 != 0 || (uVar2 ^ 7) != 0) {
    if ((uVar1 ^ 10) != 0 || (uVar2 ^ 9) != 0) {
      if (uVar3 == 0 && (uVar2 ^ 0xd) == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "asuint";
        pcVar5 = "";
LAB_0021b056:
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,pcVar6,pcVar5);
        return __return_storage_ptr__;
      }
      uVar7 = uVar2 ^ 8;
      if ((uVar1 ^ 7) != 0 || uVar7 != 0) {
        if ((uVar1 ^ 9) != 0 || (uVar2 ^ 10) != 0) {
          if ((uVar1 ^ 7) == 0 && (uVar2 ^ 0xd) == 0) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar6 = "asint";
            pcVar5 = "";
          }
          else if (((uVar1 ^ 0xd) == 0 && uVar7 == 0) || ((uVar1 ^ 0xd) == 0 && (uVar2 ^ 7) == 0)) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar6 = "asfloat";
            pcVar5 = "";
          }
          else {
            if ((uVar1 ^ 9) == 0 && (uVar2 ^ 0xe) == 0) {
              prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_50[0] = local_40;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_50,"Double to Int64 is not supported in HLSL.","");
              ::std::runtime_error::runtime_error(prVar4,(string *)local_50);
              *(undefined ***)prVar4 = &PTR__runtime_error_00357118;
              __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            if ((uVar1 ^ 10) == 0 && (uVar2 ^ 0xe) == 0) {
              prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_50[0] = local_40;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_50,"Double to UInt64 is not supported in HLSL.","");
              ::std::runtime_error::runtime_error(prVar4,(string *)local_50);
              *(undefined ***)prVar4 = &PTR__runtime_error_00357118;
              __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            if (((uVar2 ^ 9) == 0 && (uVar1 ^ 0xe) == 0) ||
               ((uVar1 ^ 0xe) == 0 && (uVar2 ^ 10) == 0)) {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              pcVar6 = "asdouble";
              pcVar5 = "";
            }
            else if (in_type->vecsize == 1 && (uVar1 == 0xc && uVar7 == 0)) {
              if (this->requires_explicit_fp16_packing == false) {
                this->requires_explicit_fp16_packing = true;
                Compiler::force_recompile((Compiler *)this);
              }
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              pcVar6 = "SPIRV_Cross_unpackFloat2x16";
              pcVar5 = "";
            }
            else if (in_type->vecsize == 2 && (uVar3 == 0 && uVar2 == 0xc)) {
              if (this->requires_explicit_fp16_packing == false) {
                this->requires_explicit_fp16_packing = true;
                Compiler::force_recompile((Compiler *)this);
              }
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              pcVar6 = "SPIRV_Cross_packFloat2x16";
              pcVar5 = "";
            }
            else {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              pcVar5 = "";
              pcVar6 = pcVar5;
            }
          }
          goto LAB_0021b056;
        }
      }
    }
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
            (__return_storage_ptr__,this,out_type,0);
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::bitcast_glsl_op(const SPIRType &out_type, const SPIRType &in_type)
{
	if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Int)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Int64)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Float)
		return "asuint";
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::UInt)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::UInt64)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Float)
		return "asint";
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::UInt)
		return "asfloat";
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::Int)
		return "asfloat";
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Double)
		SPIRV_CROSS_THROW("Double to Int64 is not supported in HLSL.");
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Double)
		SPIRV_CROSS_THROW("Double to UInt64 is not supported in HLSL.");
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::Int64)
		return "asdouble";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::UInt64)
		return "asdouble";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
	{
		if (!requires_explicit_fp16_packing)
		{
			requires_explicit_fp16_packing = true;
			force_recompile();
		}
		return "SPIRV_Cross_unpackFloat2x16";
	}
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Half && in_type.vecsize == 2)
	{
		if (!requires_explicit_fp16_packing)
		{
			requires_explicit_fp16_packing = true;
			force_recompile();
		}
		return "SPIRV_Cross_packFloat2x16";
	}
	else
		return "";
}